

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

void mi_segment_span_free
               (mi_segment_t *segment,size_t slice_index,size_t slice_count,_Bool allow_purge,
               mi_segments_tld_t *tld)

{
  size_t *psVar1;
  size_t *psVar2;
  mi_page_s *pmVar3;
  mi_page_s *pmVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  mi_msecs_t mVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  mi_page_s **ppmVar16;
  mi_slice_t *pmVar17;
  mi_option_t option;
  mi_span_queue_t *pmVar18;
  uint8_t *p;
  bool bVar19;
  size_t full_size;
  mi_commit_mask_t mask;
  size_t local_c0;
  uint8_t *local_b8;
  mi_commit_mask_t local_b0;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if ((segment->kind == MI_SEGMENT_HUGE) || (segment->thread_id == 0)) {
    pmVar18 = (mi_span_queue_t *)0x0;
  }
  else {
    sVar14 = slice_count;
    if (1 < slice_count) {
      uVar10 = slice_count - 1;
      uVar15 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      if (2 < uVar15) {
        sVar14 = ((ulong)((uint)(uVar10 >> (0x3d - ((byte)uVar15 ^ 0x3f) & 0x3f)) & 3) + uVar15 * 4)
                 - 4;
      }
    }
    pmVar18 = tld->spans + sVar14;
  }
  sVar14 = 1;
  if (1 < slice_count) {
    sVar14 = slice_count;
  }
  pmVar3 = segment->slices + slice_index;
  pmVar3->slice_count = (uint32_t)sVar14;
  pmVar3->slice_offset = 0;
  if (1 < slice_count) {
    pmVar17 = segment->slices + segment->slice_entries;
    if (pmVar3 + (sVar14 - 1) <= segment->slices + segment->slice_entries) {
      pmVar17 = pmVar3 + (sVar14 - 1);
    }
    pmVar17->slice_count = 0;
    pmVar17->slice_offset = (uint32_t)sVar14 * 0x60 - 0x60;
    pmVar17->block_size = 0;
  }
  if (allow_purge) {
    uVar10 = 0;
    if (0 < (long)((ulong)((long)(pmVar3 + -1) + 0x5f) & 0xfffffffffe000000)) {
      uVar10 = (ulong)((long)(pmVar3 + -1) + 0x5f) & 0xfffffffffe000000;
    }
    if (segment->allow_purge == true) {
      p = (uint8_t *)(((long)pmVar3 + (-0x120 - uVar10) >> 5) * -0x5555555555550000 + uVar10);
      lVar11 = mi_option_get(mi_option_purge_delay);
      if (lVar11 == 0) {
        mi_segment_purge(segment,p,sVar14 << 0x10);
      }
      else {
        local_c0 = 0;
        mi_segment_commit_mask(segment,true,p,sVar14 << 0x10,&local_b8,&local_c0,&local_b0);
        if (local_b0.mask[0] == 0) {
          uVar10 = 0;
          do {
            uVar15 = uVar10;
            if (uVar15 == 7) break;
            uVar10 = uVar15 + 1;
          } while (local_b0.mask[uVar15 + 1] == 0);
          bVar19 = 6 < uVar15;
        }
        else {
          bVar19 = false;
        }
        if ((!bVar19) && (local_c0 != 0)) {
          lVar11 = 0;
          do {
            psVar2 = (segment->commit_mask).mask + lVar11;
            uVar5 = *(uint *)((long)psVar2 + 4);
            sVar14 = psVar2[1];
            uVar6 = *(uint *)((long)psVar2 + 0xc);
            uVar7 = *(uint *)((long)local_b0.mask + lVar11 * 8 + 4);
            sVar9 = local_b0.mask[lVar11 + 1];
            uVar8 = *(uint *)((long)local_b0.mask + lVar11 * 8 + 0xc);
            *(uint *)(&uStack_70 + lVar11) = (uint)local_b0.mask[lVar11] & (uint)*psVar2;
            *(uint *)((long)&uStack_70 + lVar11 * 8 + 4) = uVar7 & uVar5;
            *(uint *)(&uStack_68 + lVar11) = (uint)sVar9 & (uint)sVar14;
            *(uint *)((long)&uStack_68 + lVar11 * 8 + 4) = uVar8 & uVar6;
            lVar11 = lVar11 + 2;
          } while (lVar11 != 8);
          lVar11 = 7;
          do {
            uVar10 = local_b0.mask[lVar11 + 2];
            psVar2 = (segment->purge_mask).mask + lVar11 + -7;
            uVar15 = psVar2[1];
            psVar1 = (segment->purge_mask).mask + lVar11 + -7;
            *psVar1 = *psVar2 | local_b0.mask[lVar11 + 1];
            psVar1[1] = uVar15 | uVar10;
            lVar11 = lVar11 + 2;
          } while (lVar11 != 0xf);
          mVar12 = _mi_clock_now();
          lVar11 = segment->purge_expire;
          if (lVar11 == 0) {
            option = mi_option_purge_delay;
          }
          else {
            lVar13 = mi_option_get(mi_option_purge_extend_delay);
            if (mVar12 < lVar11) {
              segment->purge_expire = segment->purge_expire + lVar13;
              goto LAB_0046820c;
            }
            if (lVar13 + lVar11 <= mVar12) {
              mi_segment_try_purge(segment,true);
              goto LAB_0046820c;
            }
            option = mi_option_purge_extend_delay;
          }
          lVar11 = mi_option_get(option);
          segment->purge_expire = lVar11 + mVar12;
        }
      }
    }
  }
LAB_0046820c:
  if (pmVar18 != (mi_span_queue_t *)0x0) {
    pmVar3->prev = (mi_page_s *)0x0;
    pmVar4 = pmVar18->first;
    pmVar3->next = pmVar4;
    pmVar18->first = pmVar3;
    ppmVar16 = &pmVar4->prev;
    if (pmVar4 == (mi_page_s *)0x0) {
      ppmVar16 = &pmVar18->last;
    }
    *ppmVar16 = pmVar3;
  }
  pmVar3->block_size = 0;
  return;
}

Assistant:

static void mi_segment_span_free(mi_segment_t* segment, size_t slice_index, size_t slice_count, bool allow_purge, mi_segments_tld_t* tld) {
  mi_assert_internal(slice_index < segment->slice_entries);
  mi_span_queue_t* sq = (segment->kind == MI_SEGMENT_HUGE || mi_segment_is_abandoned(segment)
                          ? NULL : mi_span_queue_for(slice_count,tld));
  if (slice_count==0) slice_count = 1;
  mi_assert_internal(slice_index + slice_count - 1 < segment->slice_entries);

  // set first and last slice (the intermediates can be undetermined)
  mi_slice_t* slice = &segment->slices[slice_index];
  slice->slice_count = (uint32_t)slice_count;
  mi_assert_internal(slice->slice_count == slice_count); // no overflow?
  slice->slice_offset = 0;
  if (slice_count > 1) {
    mi_slice_t* last = slice + slice_count - 1;
    mi_slice_t* end  = (mi_slice_t*)mi_segment_slices_end(segment);
    if (last > end) { last = end; }
    last->slice_count = 0;
    last->slice_offset = (uint32_t)(sizeof(mi_page_t)*(slice_count - 1));
    last->block_size = 0;
  }

  // perhaps decommit
  if (allow_purge) {
    mi_segment_schedule_purge(segment, mi_slice_start(slice), slice_count * MI_SEGMENT_SLICE_SIZE);
  }

  // and push it on the free page queue (if it was not a huge page)
  if (sq != NULL) mi_span_queue_push( sq, slice );
             else slice->block_size = 0; // mark huge page as free anyways
}